

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

int __thiscall sf::Shader::getUniformLocation(Shader *this,string *name)

{
  _Rb_tree_color _Var1;
  iterator iVar2;
  ostream *poVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  pStack_48;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->m_uniforms)._M_t,name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_uniforms)._M_t._M_impl.super__Rb_tree_header) {
    _Var1 = (*sf_ptrc_glGetUniformLocationARB)(this->m_shaderProgram,(name->_M_dataplus)._M_p);
    std::__cxx11::string::string((string *)&pStack_48,(string *)name);
    pStack_48.second = _Var1;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->m_uniforms,&pStack_48);
    std::__cxx11::string::~string((string *)&pStack_48);
    if (_Var1 == ~_S_red) {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"Uniform \"");
      poVar3 = std::operator<<(poVar3,(string *)name);
      poVar3 = std::operator<<(poVar3,"\" not found in shader");
      std::endl<char,std::char_traits<char>>(poVar3);
      _Var1 = ~_S_red;
    }
  }
  else {
    _Var1 = iVar2._M_node[2]._M_color;
  }
  return _Var1;
}

Assistant:

int Shader::getUniformLocation(const std::string& name)
{
    // Check the cache
    UniformTable::const_iterator it = m_uniforms.find(name);
    if (it != m_uniforms.end())
    {
        // Already in cache, return it
        return it->second;
    }
    else
    {
        // Not in cache, request the location from OpenGL
        int location = GLEXT_glGetUniformLocation(castToGlHandle(m_shaderProgram), name.c_str());
        m_uniforms.insert(std::make_pair(name, location));

        if (location == -1)
            err() << "Uniform \"" << name << "\" not found in shader" << std::endl;

        return location;
    }
}